

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

void bitset_container_add_from_range
               (bitset_container_t *bitset,uint32_t min,uint32_t max,uint16_t step)

{
  uint64_t *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  undefined6 in_register_0000000a;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  
  uVar8 = CONCAT62(in_register_0000000a,step);
  iVar5 = (int)uVar8;
  if (iVar5 != 0) {
    uVar16 = (ulong)min;
    if ((short)(0x40 % (uint)step) == 0) {
      uVar4 = 0;
      if ((uint)(uVar16 % (uVar8 & 0xffffffff)) < 0x40) {
        uVar12 = (ulong)step;
        lVar7 = (1 - uVar16 / uVar12) * uVar12;
        uVar4 = lVar7 + uVar16;
        uVar3 = 0x40;
        if (0x40 < uVar4) {
          uVar3 = uVar4;
        }
        uVar3 = uVar3 - lVar7;
        uVar9 = (ulong)(uVar3 != uVar16);
        uVar9 = (uVar3 - (uVar16 + uVar9)) / uVar12 + uVar9;
        uVar16 = uVar16 % uVar12;
        lVar7 = uVar12 + uVar16;
        auVar15._8_4_ = (int)uVar9;
        auVar15._0_8_ = uVar9;
        auVar15._12_4_ = (int)(uVar9 >> 0x20);
        uVar4 = 0xfffffffffffffffe;
        auVar14 = ZEXT816(0);
        do {
          auVar13 = auVar14;
          auVar14._8_8_ = 1L << lVar7;
          auVar14._0_8_ = 1L << uVar16;
          auVar14 = auVar14 | auVar13;
          uVar16 = uVar16 + (uint)step * 2;
          lVar7 = lVar7 + (ulong)((uint)step * 2);
          uVar4 = uVar4 + 2;
        } while ((uVar9 & 0xfffffffffffffffe) != uVar4);
        auVar17._8_4_ = (int)uVar4;
        auVar17._0_8_ = uVar4;
        auVar17._12_4_ = (int)(uVar4 >> 0x20);
        auVar15 = auVar15 ^ _DAT_001180e0;
        auVar18 = (auVar17 | _DAT_001180d0) ^ _DAT_001180e0;
        iVar2 = -(uint)(auVar15._0_4_ < auVar18._0_4_);
        iVar21 = -(uint)(auVar15._4_4_ < auVar18._4_4_);
        iVar22 = -(uint)(auVar15._8_4_ < auVar18._8_4_);
        iVar23 = -(uint)(auVar15._12_4_ < auVar18._12_4_);
        auVar24._4_4_ = iVar2;
        auVar24._0_4_ = iVar2;
        auVar24._8_4_ = iVar22;
        auVar24._12_4_ = iVar22;
        iVar2 = -(uint)(auVar18._4_4_ == auVar15._4_4_);
        iVar22 = -(uint)(auVar18._12_4_ == auVar15._12_4_);
        auVar18._4_4_ = iVar2;
        auVar18._0_4_ = iVar2;
        auVar18._8_4_ = iVar22;
        auVar18._12_4_ = iVar22;
        auVar19._4_4_ = iVar21;
        auVar19._0_4_ = iVar21;
        auVar19._8_4_ = iVar23;
        auVar19._12_4_ = iVar23;
        auVar19 = auVar19 | auVar18 & auVar24;
        auVar14 = ~auVar19 & auVar14 | auVar13 & auVar19;
        uVar4 = auVar14._8_8_ | auVar14._0_8_;
      }
      uVar6 = min >> 6;
      uVar11 = max - 1 >> 6;
      bitset->cardinality = (int32_t)((ulong)(iVar5 + max + ~min) / (uVar8 & 0xffffffff));
      uVar8 = -1L << ((byte)min & 0x3f);
      if (uVar6 == uVar11) {
        bVar10 = -(char)max;
        bitset->words[uVar6] =
             bitset->words[uVar6] | (uVar8 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f) & uVar4;
        return;
      }
      puVar1 = bitset->words;
      puVar1[uVar6] = uVar8 & uVar4;
      auVar15 = _DAT_001180e0;
      auVar14 = _DAT_001180d0;
      if (uVar6 + 1 < uVar11) {
        lVar7 = (ulong)uVar11 + (long)(int)~uVar6 + -1;
        auVar13._8_4_ = (int)lVar7;
        auVar13._0_8_ = lVar7;
        auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar8 = 0;
        auVar13 = auVar13 ^ _DAT_001180e0;
        do {
          auVar20._8_4_ = (int)uVar8;
          auVar20._0_8_ = uVar8;
          auVar20._12_4_ = (int)(uVar8 >> 0x20);
          auVar18 = (auVar20 | auVar14) ^ auVar15;
          if ((bool)(~(auVar18._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar18._0_4_ ||
                      auVar13._4_4_ < auVar18._4_4_) & 1)) {
            puVar1[(ulong)uVar6 + uVar8 + 1] = uVar4;
          }
          if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
              auVar18._12_4_ <= auVar13._12_4_) {
            puVar1[(ulong)uVar6 + uVar8 + 2] = uVar4;
          }
          uVar8 = uVar8 + 2;
        } while (((long)(int)~uVar6 + (ulong)uVar11 + 1 & 0xfffffffffffffffe) != uVar8);
      }
      bVar10 = -(char)max;
      puVar1[uVar11] = (uVar4 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
    }
    else if (min < max) {
      puVar1 = bitset->words;
      iVar2 = bitset->cardinality;
      do {
        uVar4 = (ulong)((uint)(uVar16 >> 3) & 0x1ff8);
        uVar8 = *(ulong *)((long)puVar1 + uVar4);
        uVar12 = uVar8 | 1L << (uVar16 & 0x3f);
        iVar2 = iVar2 + (int)((uVar8 ^ uVar12) >> ((byte)uVar16 & 0x3f));
        *(ulong *)((long)puVar1 + uVar4) = uVar12;
        uVar6 = (int)uVar16 + iVar5;
        uVar16 = (ulong)uVar6;
      } while (uVar6 < max);
      bitset->cardinality = iVar2;
      return;
    }
  }
  return;
}

Assistant:

void bitset_container_add_from_range(bitset_container_t *bitset, uint32_t min,
                                     uint32_t max, uint16_t step) {
    if (step == 0) return;   // refuse to crash
    if ((64 % step) == 0) {  // step divides 64
        uint64_t mask = 0;   // construct the repeated mask
        for (uint32_t value = (min % step); value < 64; value += step) {
            mask |= ((uint64_t)1 << value);
        }
        uint32_t firstword = min / 64;
        uint32_t endword = (max - 1) / 64;
        bitset->cardinality = (max - min + step - 1) / step;
        if (firstword == endword) {
            bitset->words[firstword] |=
                mask & (((~UINT64_C(0)) << (min % 64)) &
                        ((~UINT64_C(0)) >> ((~max + 1) % 64)));
            return;
        }
        bitset->words[firstword] = mask & ((~UINT64_C(0)) << (min % 64));
        for (uint32_t i = firstword + 1; i < endword; i++)
            bitset->words[i] = mask;
        bitset->words[endword] = mask & ((~UINT64_C(0)) >> ((~max + 1) % 64));
    } else {
        for (uint32_t value = min; value < max; value += step) {
            bitset_container_add(bitset, value);
        }
    }
}